

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O0

int (anonymous_namespace)::store_int<unsigned_int,char>(uint *out,char *val,uint min,uint max)

{
  int *piVar1;
  long lVar2;
  uint in_ECX;
  uint in_EDX;
  undefined4 *in_RDI;
  long val_as_long;
  int local_4;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  lVar2 = anon_unknown.dwarf_9e99::to_long((char *)CONCAT44(in_EDX,in_ECX));
  if ((lVar2 == 0) && (piVar1 = __errno_location(), *piVar1 != 0)) {
    return 3;
  }
  if ((lVar2 < (long)(ulong)in_EDX) || (lVar2 == -0x8000000000000000)) {
    local_4 = 2;
  }
  else if (((long)(ulong)in_ECX < lVar2) || (lVar2 == 0x7fffffffffffffff)) {
    local_4 = 2;
  }
  else {
    *in_RDI = (int)lVar2;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int store_int(INT_T *out, const CHAR_T *val, INT_T min, INT_T max)
{
    errno = 0;
    long val_as_long = to_long(val);
    if (val_as_long == 0 && errno != 0)
        return __CILKRTS_SET_PARAM_INVALID;
    if (val_as_long < min || val_as_long == LONG_MIN)
        return __CILKRTS_SET_PARAM_XRANGE;
    else if (val_as_long > max || val_as_long == LONG_MAX)
        return __CILKRTS_SET_PARAM_XRANGE;

    *out = val_as_long;
    return __CILKRTS_SET_PARAM_SUCCESS;
}